

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_traceback(lua_State *L)

{
  int32_t level;
  char *msg;
  TValue *pTVar1;
  lua_State *L1;
  uint uVar2;
  
  pTVar1 = L->base;
  uVar2 = 0;
  L1 = L;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff9)) {
    uVar2 = 1;
    L1 = (lua_State *)(ulong)(pTVar1->u32).lo;
  }
  msg = lua_tolstring(L,uVar2 + 1,(size_t *)0x0);
  if ((msg == (char *)0x0) &&
     (pTVar1 = (TValue *)((ulong)(uVar2 * 8) + (long)L->base), pTVar1 < L->top)) {
    L->top = pTVar1 + 1;
  }
  else {
    level = lj_lib_optint(L,uVar2 | 2,(uint)(L1 == L));
    luaL_traceback(L,L1,msg,level);
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_traceback)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *msg = lua_tostring(L, arg+1);
  if (msg == NULL && L->top > L->base+arg)
    L->top = L->base+arg+1;
  else
    luaL_traceback(L, L1, msg, lj_lib_optint(L, arg+2, (L == L1)));
  return 1;
}